

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

int sha512_done(sha512_state *md,uchar *out)

{
  unsigned_long uVar1;
  int local_24;
  int i;
  uchar *out_local;
  sha512_state *md_local;
  
  if (md == (sha512_state *)0x0) {
    md_local._4_4_ = -1;
  }
  else if (out == (uchar *)0x0) {
    md_local._4_4_ = -1;
  }
  else if (md->curlen < 0x80) {
    md->length = md->curlen * 8 + md->length;
    uVar1 = md->curlen;
    md->curlen = uVar1 + 1;
    md->buf[uVar1] = 0x80;
    if (0x70 < md->curlen) {
      while (md->curlen < 0x80) {
        uVar1 = md->curlen;
        md->curlen = uVar1 + 1;
        md->buf[uVar1] = '\0';
      }
      s_sha512_compress(md,md->buf);
      md->curlen = 0;
    }
    while (md->curlen < 0x78) {
      uVar1 = md->curlen;
      md->curlen = uVar1 + 1;
      md->buf[uVar1] = '\0';
    }
    md->buf[0x78] = (uchar)(md->length >> 0x38);
    md->buf[0x79] = (uchar)(md->length >> 0x30);
    md->buf[0x7a] = (uchar)(md->length >> 0x28);
    md->buf[0x7b] = (uchar)(md->length >> 0x20);
    md->buf[0x7c] = (uchar)(md->length >> 0x18);
    md->buf[0x7d] = (uchar)(md->length >> 0x10);
    md->buf[0x7e] = (uchar)(md->length >> 8);
    md->buf[0x7f] = (uchar)md->length;
    s_sha512_compress(md,md->buf);
    for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
      out[local_24 << 3] = (uchar)(md->state[local_24] >> 0x38);
      out[(long)(local_24 << 3) + 1] = (uchar)(md->state[local_24] >> 0x30);
      out[(long)(local_24 << 3) + 2] = (uchar)(md->state[local_24] >> 0x28);
      out[(long)(local_24 << 3) + 3] = (uchar)(md->state[local_24] >> 0x20);
      out[(long)(local_24 << 3) + 4] = (uchar)(md->state[local_24] >> 0x18);
      out[(long)(local_24 << 3) + 5] = (uchar)(md->state[local_24] >> 0x10);
      out[(long)(local_24 << 3) + 6] = (uchar)(md->state[local_24] >> 8);
      out[(long)(local_24 << 3) + 7] = (uchar)md->state[local_24];
    }
    md_local._4_4_ = 0;
  }
  else {
    md_local._4_4_ = -1;
  }
  return md_local._4_4_;
}

Assistant:

static int sha512_done(struct sha512_state * md, unsigned char *out)
{
    int i;

    if (md == NULL) return -1;
    if (out == NULL) return -1;

    if (md->curlen >= sizeof(md->buf)) {
       return -1;
    }

    /* increase the length of the message */
    md->length += md->curlen * CONST64(8);

    /* append the '1' bit */
    md->buf[md->curlen++] = (unsigned char)0x80;

    /* if the length is currently above 112 bytes we append zeros
     * then compress.  Then we can fall back to padding zeros and length
     * encoding like normal.
     */
    if (md->curlen > 112) {
        while (md->curlen < 128) {
            md->buf[md->curlen++] = (unsigned char)0;
        }
        s_sha512_compress(md, md->buf);
        md->curlen = 0;
    }

    /* pad upto 120 bytes of zeroes
     * note: that from 112 to 120 is the 64 MSB of the length.  We assume that you won't hash
     * > 2^64 bits of data... :-)
     */
    while (md->curlen < 120) {
        md->buf[md->curlen++] = (unsigned char)0;
    }

    /* store length */
    STORE64H(md->length, md->buf+120);
    s_sha512_compress(md, md->buf);

    /* copy output */
    for (i = 0; i < 8; i++) {
        STORE64H(md->state[i], out+(8*i));
    }

    return 0;
}